

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O2

void __thiscall
aggreports::WriteWheatsheafMean
          (aggreports *this,vector<int,_std::allocator<int>_> *fileIDs,int epcalc,int eptype,
          int eptype_tvar,
          map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
          *mean_map)

{
  pointer pmVar1;
  code *pcVar2;
  _Rb_tree_node_base *p_Var3;
  int iVar4;
  long *plVar5;
  pointer pmVar6;
  double dVar7;
  pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_> s;
  
  if ((mean_map->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    for (p_Var3 = (mean_map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(mean_map->_M_t)._M_impl.super__Rb_tree_header;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>::pair
                (&s,(pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_> *)
                    (p_Var3 + 1));
      pmVar1 = s.second.super__Vector_base<mean_count,_std::allocator<mean_count>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pmVar6 = s.second.super__Vector_base<mean_count,_std::allocator<mean_count>_>._M_impl.
                    super__Vector_impl_data._M_start; pmVar6 != pmVar1; pmVar6 = pmVar6 + 1) {
        pcVar2 = (code *)this->WriteEPTOutput;
        if (pcVar2 != (code *)0x0) {
          plVar5 = (long *)((long)&this->totalperiods_ + *(long *)&this->field_0x158);
          if (((ulong)pcVar2 & 1) != 0) {
            pcVar2 = *(code **)(pcVar2 + *plVar5 + -1);
          }
          iVar4 = pmVar6->count;
          if (iVar4 < 2) {
            iVar4 = 1;
          }
          dVar7 = pmVar6->mean / (double)iVar4;
          (*pcVar2)(pmVar6->retperiod,CONCAT44((int)((ulong)dVar7 >> 0x20),(float)dVar7),plVar5,
                    fileIDs,s.first,epcalc,eptype);
        }
      }
      std::_Vector_base<mean_count,_std::allocator<mean_count>_>::~_Vector_base
                (&s.second.super__Vector_base<mean_count,_std::allocator<mean_count>_>);
    }
  }
  return;
}

Assistant:

void aggreports::WriteWheatsheafMean(const std::vector<int> &fileIDs,
	int epcalc, int eptype, int eptype_tvar,
	std::map<int, std::vector<mean_count>> *mean_map) {

  if (mean_map->size() == 0) return;

#ifdef ORD_OUTPUT
  if (os_ept_exists_ == false) {
    if (parquetFileNames_[EPT] != "") {
      os_ept_ = GetParquetStreamWriter(EPT);
      os_ept_exists_ = true;
    }
  }
#endif

  for (auto s : *mean_map) {
    std::vector<mean_count> &rmc = s.second;
    int i = 1;

    for (auto mc : rmc) {

      if (WriteEPTOutput != nullptr) {
	(this->*WriteEPTOutput)(fileIDs, s.first, epcalc, eptype, mc.retperiod,
				mc.mean / std::max(mc.count, 1));
      }

#ifdef ORD_OUTPUT
      if (parquetFileNames_[EPT] != "") {
	WriteParquetOutput(os_ept_, s.first, epcalc, eptype, mc.retperiod,
			   mc.mean / std::max(mc.count, 1));
      }
#endif

      i++;

    }

  }

}